

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_ManComputeOutputRequired(Of_Man_t *p,int fCleanRefs)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int local_20;
  int Delay;
  int Id;
  int i;
  int fCleanRefs_local;
  Of_Man_t *p_local;
  
  local_20 = 0;
  for (Delay = 0; iVar2 = Gia_ManObjNum(p->pGia), Delay < iVar2; Delay = Delay + 1) {
    Of_ObjSetRequired(p,Delay,1000000000);
    if (fCleanRefs != 0) {
      Of_ObjSetRefNum(p,Delay,0);
    }
  }
  for (Delay = 0; iVar2 = Vec_IntSize(p->pGia->vCos), Delay < iVar2; Delay = Delay + 1) {
    pGVar1 = p->pGia;
    pGVar3 = Gia_ManCo(p->pGia,Delay);
    iVar2 = Gia_ObjFaninId0p(pGVar1,pGVar3);
    iVar2 = Of_ObjDelay1(p,iVar2);
    local_20 = Abc_MaxInt(local_20,iVar2);
  }
  for (Delay = 0; iVar2 = Vec_IntSize(p->pGia->vCos), Delay < iVar2; Delay = Delay + 1) {
    pGVar1 = p->pGia;
    pGVar3 = Gia_ManCo(p->pGia,Delay);
    iVar2 = Gia_ObjFaninId0p(pGVar1,pGVar3);
    Of_ObjUpdateRequired(p,iVar2,local_20);
    if (fCleanRefs != 0) {
      Of_ObjRefInc(p,iVar2);
    }
  }
  if ((p->pPars->Delay != 0) && (p->pPars->Delay < (ulong)(long)local_20)) {
    printf("Error: Delay violation.\n");
  }
  p->pPars->Delay = (long)local_20;
  return local_20;
}

Assistant:

static inline int Of_ManComputeOutputRequired( Of_Man_t * p, int fCleanRefs )
{
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Of_ObjSetRequired( p, i, ABC_INFINITY );
        if ( fCleanRefs )
            Of_ObjSetRefNum( p, i, 0 );
    }
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Of_ObjDelay1(p, Id) );
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
    {
        Of_ObjUpdateRequired( p, Id, Delay );
        if ( fCleanRefs )
            Of_ObjRefInc( p, Id );
    }
    if ( p->pPars->Delay && p->pPars->Delay < Delay )
        printf( "Error: Delay violation.\n" );
    p->pPars->Delay = Delay;
    return Delay;
}